

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  lws_vhost *vhost;
  lws_plat_file_ops *plVar4;
  long lVar5;
  char *pcVar6;
  lws_plat_file_ops *plVar7;
  uint uVar8;
  byte bVar9;
  int local_fbc;
  int local_fb8;
  uint local_fb4;
  char *local_fb0;
  timeval tv;
  lws_context_creation_info local_f98;
  char interface_name [128];
  char key_path [1024];
  char cert_path [1024];
  char ca_path [1024];
  
  bVar9 = 0;
  interface_name[0x70] = '\0';
  interface_name[0x71] = '\0';
  interface_name[0x72] = '\0';
  interface_name[0x73] = '\0';
  interface_name[0x74] = '\0';
  interface_name[0x75] = '\0';
  interface_name[0x76] = '\0';
  interface_name[0x77] = '\0';
  interface_name[0x78] = '\0';
  interface_name[0x79] = '\0';
  interface_name[0x7a] = '\0';
  interface_name[0x7b] = '\0';
  interface_name[0x7c] = '\0';
  interface_name[0x7d] = '\0';
  interface_name[0x7e] = '\0';
  interface_name[0x7f] = '\0';
  interface_name[0x60] = '\0';
  interface_name[0x61] = '\0';
  interface_name[0x62] = '\0';
  interface_name[99] = '\0';
  interface_name[100] = '\0';
  interface_name[0x65] = '\0';
  interface_name[0x66] = '\0';
  interface_name[0x67] = '\0';
  interface_name[0x68] = '\0';
  interface_name[0x69] = '\0';
  interface_name[0x6a] = '\0';
  interface_name[0x6b] = '\0';
  interface_name[0x6c] = '\0';
  interface_name[0x6d] = '\0';
  interface_name[0x6e] = '\0';
  interface_name[0x6f] = '\0';
  interface_name[0x50] = '\0';
  interface_name[0x51] = '\0';
  interface_name[0x52] = '\0';
  interface_name[0x53] = '\0';
  interface_name[0x54] = '\0';
  interface_name[0x55] = '\0';
  interface_name[0x56] = '\0';
  interface_name[0x57] = '\0';
  interface_name[0x58] = '\0';
  interface_name[0x59] = '\0';
  interface_name[0x5a] = '\0';
  interface_name[0x5b] = '\0';
  interface_name[0x5c] = '\0';
  interface_name[0x5d] = '\0';
  interface_name[0x5e] = '\0';
  interface_name[0x5f] = '\0';
  interface_name[0x40] = '\0';
  interface_name[0x41] = '\0';
  interface_name[0x42] = '\0';
  interface_name[0x43] = '\0';
  interface_name[0x44] = '\0';
  interface_name[0x45] = '\0';
  interface_name[0x46] = '\0';
  interface_name[0x47] = '\0';
  interface_name[0x48] = '\0';
  interface_name[0x49] = '\0';
  interface_name[0x4a] = '\0';
  interface_name[0x4b] = '\0';
  interface_name[0x4c] = '\0';
  interface_name[0x4d] = '\0';
  interface_name[0x4e] = '\0';
  interface_name[0x4f] = '\0';
  interface_name[0x30] = '\0';
  interface_name[0x31] = '\0';
  interface_name[0x32] = '\0';
  interface_name[0x33] = '\0';
  interface_name[0x34] = '\0';
  interface_name[0x35] = '\0';
  interface_name[0x36] = '\0';
  interface_name[0x37] = '\0';
  interface_name[0x38] = '\0';
  interface_name[0x39] = '\0';
  interface_name[0x3a] = '\0';
  interface_name[0x3b] = '\0';
  interface_name[0x3c] = '\0';
  interface_name[0x3d] = '\0';
  interface_name[0x3e] = '\0';
  interface_name[0x3f] = '\0';
  interface_name[0x20] = '\0';
  interface_name[0x21] = '\0';
  interface_name[0x22] = '\0';
  interface_name[0x23] = '\0';
  interface_name[0x24] = '\0';
  interface_name[0x25] = '\0';
  interface_name[0x26] = '\0';
  interface_name[0x27] = '\0';
  interface_name[0x28] = '\0';
  interface_name[0x29] = '\0';
  interface_name[0x2a] = '\0';
  interface_name[0x2b] = '\0';
  interface_name[0x2c] = '\0';
  interface_name[0x2d] = '\0';
  interface_name[0x2e] = '\0';
  interface_name[0x2f] = '\0';
  interface_name[0x10] = '\0';
  interface_name[0x11] = '\0';
  interface_name[0x12] = '\0';
  interface_name[0x13] = '\0';
  interface_name[0x14] = '\0';
  interface_name[0x15] = '\0';
  interface_name[0x16] = '\0';
  interface_name[0x17] = '\0';
  interface_name[0x18] = '\0';
  interface_name[0x19] = '\0';
  interface_name[0x1a] = '\0';
  interface_name[0x1b] = '\0';
  interface_name[0x1c] = '\0';
  interface_name[0x1d] = '\0';
  interface_name[0x1e] = '\0';
  interface_name[0x1f] = '\0';
  interface_name[0] = '\0';
  interface_name[1] = '\0';
  interface_name[2] = '\0';
  interface_name[3] = '\0';
  interface_name[4] = '\0';
  interface_name[5] = '\0';
  interface_name[6] = '\0';
  interface_name[7] = '\0';
  interface_name[8] = '\0';
  interface_name[9] = '\0';
  interface_name[10] = '\0';
  interface_name[0xb] = '\0';
  interface_name[0xc] = '\0';
  interface_name[0xd] = '\0';
  interface_name[0xe] = '\0';
  interface_name[0xf] = '\0';
  memset(cert_path,0,0x400);
  memset(key_path,0,0x400);
  memset(ca_path,0,0x400);
  memset(&local_f98,0,0x2e0);
  local_f98.port = 0x1e01;
  local_fb0 = (char *)0x0;
  local_fbc = -1;
  bVar1 = false;
  local_fb4 = 0;
  uVar8 = 0;
  local_fb8 = local_fbc;
switchD_0010c3bf_caseD_51:
  iVar2 = getopt_long(argc,argv,"eci:hsap:d:DC:K:A:R:vu:g:P:kU:n",options,0);
  if (iVar2 < 0) {
    signal(2,sighandler);
    signal(10,sighandler);
    lws_set_log_level(debug_level,(_func_void_int_char_ptr *)0x0);
    _lws_log(4,"libwebsockets test server - license MIT\n");
    _lws_log(4,"(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");
    printf("Using resource path \"%s\"\n",resource_path);
    pcVar6 = resource_path;
    local_f98.iface = local_fb0;
    local_f98.protocols = protocols;
    local_f98.ssl_cert_filepath = (char *)0x0;
    local_f98.ssl_private_key_filepath = (char *)0x0;
    local_f98.ws_ping_pong_interval = (unsigned_short)local_fb4;
    if (bVar1) {
      sVar3 = strlen(resource_path);
      if (sVar3 < 0x3e1) {
        if (cert_path[0] == '\0') {
          sprintf(cert_path,"%s/libwebsockets-test-server.pem",pcVar6);
          pcVar6 = resource_path;
        }
        sVar3 = strlen(pcVar6);
        if (sVar3 < 0x3e1) {
          if (key_path[0] == '\0') {
            sprintf(key_path,"%s/libwebsockets-test-server.key.pem",pcVar6);
          }
          local_f98.ssl_cert_filepath = cert_path;
          local_f98.ssl_private_key_filepath = key_path;
          if (ca_path[0] != '\0') {
            local_f98.ssl_ca_filepath = ca_path;
          }
          goto LAB_0010c707;
        }
      }
      pcVar6 = "resource path too long\n";
    }
    else {
LAB_0010c707:
      local_f98.options = (uint64_t)(uVar8 | 0x2100);
      local_f98.gid = local_fbc;
      local_f98.uid = local_fb8;
      local_f98.extensions = exts;
      local_f98.timeout_secs = 5;
      local_f98.ssl_cipher_list =
           "ECDHE-ECDSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-GCM-SHA384:DHE-RSA-AES256-GCM-SHA384:ECDHE-RSA-AES256-SHA384:HIGH:!aNULL:!eNULL:!EXPORT:!DES:!MD5:!PSK:!RC4:!HMAC_SHA1:!SHA1:!DHE-RSA-AES128-GCM-SHA256:!DHE-RSA-AES128-SHA256:!AES128-GCM-SHA256:!AES128-SHA256:!DHE-RSA-AES256-SHA256:!AES256-GCM-SHA384:!AES256-SHA256"
      ;
      local_f98.mounts = &mount;
      local_f98.ip_limit_ah = 0x18;
      local_f98.ip_limit_wsi = 400;
      if (bVar1) {
        local_f98.options = local_f98.options | 0x1800;
      }
      context = lws_create_context(&local_f98);
      if (context == (lws_context *)0x0) {
        pcVar6 = "libwebsocket init failed\n";
      }
      else {
        local_f98.pvo = &pvo;
        vhost = lws_create_vhost(context,&local_f98);
        if (vhost != (lws_vhost *)0x0) {
          local_f98.port = local_f98.port + 1;
          lws_init_vhost_client_ssl(&local_f98,vhost);
          plVar4 = lws_get_fops(context);
          plVar7 = &fops_plat;
          for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
            plVar7->open = plVar4->open;
            plVar4 = (lws_plat_file_ops *)((long)plVar4 + (ulong)bVar9 * -0x10 + 8);
            plVar7 = (lws_plat_file_ops *)((long)plVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          }
          plVar4 = lws_get_fops(context);
          plVar4->open = test_server_fops_open;
          iVar2 = 0;
          while ((-1 < iVar2 && (force_exit == 0))) {
            gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
            iVar2 = lws_service(context,0);
            if (dynamic_vhost == (lws_vhost *)0x0 && dynamic_vhost_enable != 0) {
              _lws_log(4,"creating dynamic vhost...\n");
              dynamic_vhost = lws_create_vhost(context,&local_f98);
            }
            else if (dynamic_vhost_enable == 0 && dynamic_vhost != (lws_vhost *)0x0) {
              _lws_log(4,"destroying dynamic vhost...\n");
              lws_vhost_destroy(dynamic_vhost);
              dynamic_vhost = (lws_vhost *)0x0;
            }
          }
          lws_context_destroy(context);
          _lws_log(4,"libwebsockets-test-server exited cleanly\n");
          return 0;
        }
        pcVar6 = "vhost creation failed\n";
      }
    }
    _lws_log(1,pcVar6);
    return -1;
  }
  switch(iVar2) {
  case 0x50:
    local_fb4 = atoi(_optarg);
    _lws_log(4,"Setting pingpong interval to %d\n",(ulong)local_fb4);
  case 0x51:
  case 0x53:
  case 0x54:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x66:
  case 0x6a:
  case 0x6c:
  case 0x6d:
  case 0x6f:
  case 0x71:
  case 0x72:
  case 0x74:
    goto switchD_0010c3bf_caseD_51;
  case 0x52:
    lws_strncpy(crl_path,_optarg,0x400);
    goto switchD_0010c3bf_caseD_51;
  case 0x55:
    lws_strncpy(interface_name,_optarg,0x80);
    uVar8 = uVar8 | 0x4000;
    break;
  case 0x61:
    uVar8 = uVar8 | 0x1008;
    goto switchD_0010c3bf_caseD_51;
  case 99:
    close_testing = 1;
    fwrite(" Close testing mode -- closes on client after 50 dumb incrementsand suppresses lws_mirror spam\n"
           ,0x5f,1,_stderr);
    goto switchD_0010c3bf_caseD_51;
  case 100:
    debug_level = atoi(_optarg);
    goto switchD_0010c3bf_caseD_51;
  case 0x65:
    uVar8 = uVar8 | 0x10;
    goto switchD_0010c3bf_caseD_51;
  case 0x67:
    local_fbc = atoi(_optarg);
    goto switchD_0010c3bf_caseD_51;
  case 0x68:
    goto switchD_0010c3bf_caseD_68;
  case 0x69:
    lws_strncpy(interface_name,_optarg,0x80);
    break;
  case 0x6b:
    local_f98.bind_iface = 1;
    goto switchD_0010c3bf_caseD_51;
  case 0x6e:
    test_options._0_1_ = (byte)test_options | 1;
    goto switchD_0010c3bf_caseD_51;
  case 0x70:
    local_f98.port = atoi(_optarg);
    goto switchD_0010c3bf_caseD_51;
  case 0x73:
    uVar8 = uVar8 | 0x1000;
    goto LAB_0010c431;
  case 0x75:
    local_fb8 = atoi(_optarg);
    goto switchD_0010c3bf_caseD_51;
  case 0x76:
    uVar8 = uVar8 | 0x1002;
LAB_0010c431:
    bVar1 = true;
    goto switchD_0010c3bf_caseD_51;
  default:
    if (iVar2 == 0x41) {
      lws_strncpy(ca_path,_optarg,0x400);
    }
    else if (iVar2 == 0x43) {
      lws_strncpy(cert_path,_optarg,0x400);
    }
    else if (iVar2 == 0x4b) {
      lws_strncpy(key_path,_optarg,0x400);
    }
    goto switchD_0010c3bf_caseD_51;
  }
  local_fb0 = interface_name;
  goto switchD_0010c3bf_caseD_51;
switchD_0010c3bf_caseD_68:
  fwrite("Usage: test-server [--port=<p>] [--ssl] [-d <log bitfield>]\n",0x3c,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	struct lws_context_creation_info info;
	struct lws_vhost *vhost;
	char interface_name[128] = "";
	const char *iface = NULL;
	char cert_path[1024] = "";
	char key_path[1024] = "";
	char ca_path[1024] = "";
	int uid = -1, gid = -1;
	int use_ssl = 0;
	int pp_secs = 0;
	int opts = 0;
	int n = 0;
#ifndef LWS_NO_DAEMONIZE
	int daemonize = 0;
#endif

	/*
	 * take care to zero down the info struct, he contains random garbaage
	 * from the stack otherwise
	 */
	memset(&info, 0, sizeof info);
	info.port = 7681;

	while (n >= 0) {
#if defined(LWS_HAS_GETOPT_LONG) || defined(WIN32)
		n = getopt_long(argc, argv, "eci:hsap:d:DC:K:A:R:vu:g:P:kU:n", options, NULL);
#else
		n = getopt(argc, argv, "eci:hsap:d:DC:K:A:R:vu:g:P:kU:n");
#endif
		if (n < 0)
			continue;
		switch (n) {
		case 'e':
			opts |= LWS_SERVER_OPTION_LIBEV;
			break;
#ifndef LWS_NO_DAEMONIZE
		case 'D':
			daemonize = 1;
			break;
#endif
		case 'u':
			uid = atoi(optarg);
			break;
		case 'g':
			gid = atoi(optarg);
			break;
		case 'd':
			debug_level = atoi(optarg);
			break;
		case 'n':
			/* no dumb increment send */
			test_options |= 1;
			break;
		case 's':
			use_ssl = 1;
			opts |= LWS_SERVER_OPTION_DO_SSL_GLOBAL_INIT;
			break;
		case 'a':
			opts |= LWS_SERVER_OPTION_ALLOW_NON_SSL_ON_SSL_PORT;
			break;
		case 'p':
			info.port = atoi(optarg);
			break;
		case 'i':
			lws_strncpy(interface_name, optarg, sizeof interface_name);
			iface = interface_name;
			break;
		case 'U':
			lws_strncpy(interface_name, optarg, sizeof interface_name);
			iface = interface_name;
			opts |= LWS_SERVER_OPTION_UNIX_SOCK;
			break;
		case 'k':
			info.bind_iface = 1;
#if defined(LWS_HAVE_SYS_CAPABILITY_H) && defined(LWS_HAVE_LIBCAP)
			info.caps[0] = CAP_NET_RAW;
			info.count_caps = 1;
#endif
			break;
		case 'c':
			close_testing = 1;
			fprintf(stderr, " Close testing mode -- closes on "
					   "client after 50 dumb increments"
					   "and suppresses lws_mirror spam\n");
			break;
		case 'C':
			lws_strncpy(cert_path, optarg, sizeof(cert_path));
			break;
		case 'K':
			lws_strncpy(key_path, optarg, sizeof(key_path));
			break;
		case 'A':
			lws_strncpy(ca_path, optarg, sizeof(ca_path));
			break;
		case 'P':
			pp_secs = atoi(optarg);
			lwsl_notice("Setting pingpong interval to %d\n", pp_secs);
			break;
#if defined(LWS_WITH_TLS)
		case 'v':
			use_ssl = 1;
			opts |= LWS_SERVER_OPTION_REQUIRE_VALID_OPENSSL_CLIENT_CERT;
			break;

#if defined(LWS_HAVE_SSL_CTX_set1_param)
		case 'R':
			lws_strncpy(crl_path, optarg, sizeof(crl_path));
			break;
#endif
#endif
		case 'h':
			fprintf(stderr, "Usage: test-server "
					"[--port=<p>] [--ssl] "
					"[-d <log bitfield>]\n");
			exit(1);
		}
	}

#if !defined(LWS_NO_DAEMONIZE) && !defined(WIN32)
	/*
	 * normally lock path would be /var/lock/lwsts or similar, to
	 * simplify getting started without having to take care about
	 * permissions or running as root, set to /tmp/.lwsts-lock
	 */
	if (daemonize && lws_daemonize("/tmp/.lwsts-lock")) {
		fprintf(stderr, "Failed to daemonize\n");
		return 10;
	}
#endif

	signal(SIGINT, sighandler);
#if !defined(WIN32) && !defined(_WIN32)
	/* because windows is too dumb to have SIGUSR1... */
	/* dynamic vhost create / destroy toggle (on port + 1) */
	signal(SIGUSR1, sighandler);
#endif

	/* tell the library what debug level to emit and to send it to stderr */
	lws_set_log_level(debug_level, NULL);

	lwsl_notice("libwebsockets test server - license MIT\n");
	lwsl_notice("(C) Copyright 2010-2018 Andy Green <andy@warmcat.com>\n");

	printf("Using resource path \"%s\"\n", resource_path);
#if defined(LWS_WITH_EXTERNAL_POLL)
#if !defined(WIN32) && !defined(_WIN32) && !defined(__ANDROID__)
	max_poll_elements = getdtablesize();
#else
	max_poll_elements = sysconf(_SC_OPEN_MAX);
#endif
	pollfds = malloc(max_poll_elements * sizeof (struct lws_pollfd));
	fd_lookup = malloc(max_poll_elements * sizeof (int));
	if (pollfds == NULL || fd_lookup == NULL) {
		lwsl_err("Out of memory pollfds=%d\n", max_poll_elements);
		return -1;
	}
#endif

	info.iface = iface;
	info.protocols = protocols;
	info.ssl_cert_filepath = NULL;
	info.ssl_private_key_filepath = NULL;
	info.ws_ping_pong_interval = pp_secs;

	if (use_ssl) {
		if (strlen(resource_path) > sizeof(cert_path) - 32) {
			lwsl_err("resource path too long\n");
			return -1;
		}
		if (!cert_path[0])
			sprintf(cert_path, "%s/libwebsockets-test-server.pem",
								resource_path);
		if (strlen(resource_path) > sizeof(key_path) - 32) {
			lwsl_err("resource path too long\n");
			return -1;
		}
		if (!key_path[0])
			sprintf(key_path, "%s/libwebsockets-test-server.key.pem",
								resource_path);

		info.ssl_cert_filepath = cert_path;
		info.ssl_private_key_filepath = key_path;
		if (ca_path[0])
			info.ssl_ca_filepath = ca_path;
	}
	info.gid = gid;
	info.uid = uid;
	info.options = opts | LWS_SERVER_OPTION_VALIDATE_UTF8 | LWS_SERVER_OPTION_EXPLICIT_VHOSTS;
	info.extensions = exts;
	info.timeout_secs = 5;
	info.ssl_cipher_list = "ECDHE-ECDSA-AES256-GCM-SHA384:"
			       "ECDHE-RSA-AES256-GCM-SHA384:"
			       "DHE-RSA-AES256-GCM-SHA384:"
			       "ECDHE-RSA-AES256-SHA384:"
			       "HIGH:!aNULL:!eNULL:!EXPORT:"
			       "!DES:!MD5:!PSK:!RC4:!HMAC_SHA1:"
			       "!SHA1:!DHE-RSA-AES128-GCM-SHA256:"
			       "!DHE-RSA-AES128-SHA256:"
			       "!AES128-GCM-SHA256:"
			       "!AES128-SHA256:"
			       "!DHE-RSA-AES256-SHA256:"
			       "!AES256-GCM-SHA384:"
			       "!AES256-SHA256";
	info.mounts = &mount;
	info.ip_limit_ah = 24; /* for testing */
	info.ip_limit_wsi = 400; /* for testing */

	if (use_ssl)
		/* redirect guys coming on http */
		info.options |= LWS_SERVER_OPTION_REDIRECT_HTTP_TO_HTTPS;

	context = lws_create_context(&info);
	if (context == NULL) {
		lwsl_err("libwebsocket init failed\n");
		return -1;
	}

	info.pvo = &pvo;

	vhost = lws_create_vhost(context, &info);
	if (!vhost) {
		lwsl_err("vhost creation failed\n");
		return -1;
	}

	/*
	 * For testing dynamic vhost create / destroy later, we use port + 1
	 * Normally if you were creating more vhosts, you would set info.name
	 * for each to be the hostname external clients use to reach it
	 */

	info.port++;

#if defined(LWS_WITH_CLIENT) && defined(LWS_WITH_TLS)
	lws_init_vhost_client_ssl(&info, vhost);
#endif

	/* this shows how to override the lws file operations.	You don't need
	 * to do any of this unless you have a reason (eg, want to serve
	 * compressed files without decompressing the whole archive)
	 */
	/* stash original platform fops */
	fops_plat = *(lws_get_fops(context));
	/* override the active fops */
	lws_get_fops(context)->open = test_server_fops_open;

	n = 0;
	while (n >= 0 && !force_exit) {
		struct timeval tv;

		gettimeofday(&tv, NULL);

		/*
		 * This provokes the LWS_CALLBACK_SERVER_WRITEABLE for every
		 * live websocket connection using the DUMB_INCREMENT protocol,
		 * as soon as it can take more packets (usually immediately)
		 */

#if defined(LWS_WITH_EXTERNAL_POLL)
		/*
		 * this represents an existing server's single poll action
		 * which also includes libwebsocket sockets
		 */
		n = poll(pollfds, count_pollfds, 50);
		if (n < 0)
			continue;

		if (n) {
			for (n = 0; n < count_pollfds; n++)
				if (pollfds[n].revents)
					/*
					* returns immediately if the fd does not
					* match anything under libwebsockets
					* control
					*/
					if (lws_service_fd(context,
								  &pollfds[n]) < 0)
						goto done;

			/* if needed, force-service wsis that may not have read all input */
			while (!lws_service_adjust_timeout(context, 1, 0)) {
				lwsl_notice("extpoll doing forced service!\n");
				lws_service_tsi(context, -1, 0);
			}
		}
#else
		/*
		 * If libwebsockets sockets are all we care about,
		 * you can use this api which takes care of the poll()
		 * and looping through finding who needed service.
		 */

		n = lws_service(context, 0);
#endif

		if (dynamic_vhost_enable && !dynamic_vhost) {
			lwsl_notice("creating dynamic vhost...\n");
			dynamic_vhost = lws_create_vhost(context, &info);
		} else
			if (!dynamic_vhost_enable && dynamic_vhost) {
				lwsl_notice("destroying dynamic vhost...\n");
				lws_vhost_destroy(dynamic_vhost);
				dynamic_vhost = NULL;
			}

	}

#if defined(LWS_WITH_EXTERNAL_POLL)
done:
#endif

	lws_context_destroy(context);

	lwsl_notice("libwebsockets-test-server exited cleanly\n");

	return 0;
}